

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_by_2_internal.c
# Opt level: O2

void WebRtcSpl_DownBy2ShortToInt(int16_t *in,int32_t len,int32_t *out,int32_t *state)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)(len >> 1);
  if (len >> 1 < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    uVar3 = (int)in[uVar1 * 2] << 0xf | 0x4000;
    iVar4 = state[1];
    iVar5 = ((int)((uVar3 - iVar4) + 0x2000) >> 0xe) * 0xbea + *state;
    *state = uVar3;
    state[1] = iVar5;
    iVar5 = iVar5 - state[2];
    iVar4 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x2498 + iVar4;
    iVar5 = iVar4 - state[3];
    iVar5 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x3ad7 + state[2];
    state[3] = iVar5;
    state[2] = iVar4;
    out[uVar1] = iVar5 >> 1;
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    uVar3 = (int)in[uVar1 * 2 + 1] << 0xf | 0x4000;
    iVar4 = state[5];
    iVar5 = ((int)((uVar3 - iVar4) + 0x2000) >> 0xe) * 0x335 + state[4];
    state[4] = uVar3;
    state[5] = iVar5;
    iVar5 = iVar5 - state[6];
    iVar4 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x17de + iVar4;
    iVar5 = iVar4 - state[7];
    iVar5 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x305e + state[6];
    state[7] = iVar5;
    state[6] = iVar4;
    out[uVar1] = out[uVar1] + (iVar5 >> 1);
  }
  return;
}

Assistant:

void WebRtcSpl_DownBy2ShortToInt(const int16_t *in,
                                  int32_t len,
                                  int32_t *out,
                                  int32_t *state)
{
    int32_t tmp0, tmp1, diff;
    int32_t i;

    len >>= 1;

    // lower allpass filter (operates on even input samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
        diff = tmp0 - state[1];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[0] + diff * kResampleAllpass[1][0];
        state[0] = tmp0;
        diff = tmp1 - state[2];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[1] + diff * kResampleAllpass[1][1];
        state[1] = tmp1;
        diff = tmp0 - state[3];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[3] = state[2] + diff * kResampleAllpass[1][2];
        state[2] = tmp0;

        // divide by two and store temporarily
        out[i] = (state[3] >> 1);
    }

    in++;

    // upper allpass filter (operates on odd input samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
        diff = tmp0 - state[5];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[4] + diff * kResampleAllpass[0][0];
        state[4] = tmp0;
        diff = tmp1 - state[6];
        // scale down and round
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[5] + diff * kResampleAllpass[0][1];
        state[5] = tmp1;
        diff = tmp0 - state[7];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[7] = state[6] + diff * kResampleAllpass[0][2];
        state[6] = tmp0;

        // divide by two and store temporarily
        out[i] += (state[7] >> 1);
    }

    in--;
}